

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  pointer *pppVar1;
  pointer pfVar2;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  real rVar5;
  float x;
  pair<float,_int> local_38;
  
  lVar3 = 0;
  lVar4 = 0;
  do {
    pfVar2 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pfVar2 >> 2 <= lVar4) {
      return;
    }
    x = pfVar2[lVar4];
    if (threshold <= x) {
      if ((long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
        rVar5 = std_log(x);
        if (rVar5 < ((heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->first) goto LAB_0013eb90;
        x = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
      }
      rVar5 = std_log(x);
      local_38 = (pair<float,_int>)(CONCAT44(extraout_var,rVar5) + lVar3);
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<std::pair<float,int>>
                ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38
                );
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
                 (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish,comparePairs);
      __first._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(long)k < (ulong)((long)__last._M_current - (long)__first._M_current >> 3)) {
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (__first,__last,comparePairs);
        pppVar1 = &(heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + -1;
      }
    }
LAB_0013eb90:
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x100000000;
  } while( true );
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(std_log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}